

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O2

void __thiscall QtPrivate::ExceptionStore::rethrowException(ExceptionStore *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  exception_ptr eStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,&this->exceptionHolder);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    uVar1 = std::rethrow_exception((exception_ptr)&eStack_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      _Unwind_Resume(uVar1);
    }
  }
  __stack_chk_fail();
}

Assistant:

void ExceptionStore::rethrowException() const
{
    Q_ASSERT(hasException());
    std::rethrow_exception(exceptionHolder);
}